

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx512::forwardDilation_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t _elemsize;
  _func_int *p_Var7;
  _func_int **pp_Var8;
  size_t sVar9;
  size_t sVar10;
  Layer *pLVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  ulong uVar17;
  void *pvVar18;
  undefined4 *puVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  uint _w;
  long lVar23;
  undefined4 *puVar24;
  long lVar25;
  int iVar26;
  undefined4 *puVar27;
  ulong uVar28;
  uint _h;
  bool bVar29;
  Option opt_g;
  long local_180;
  long local_178;
  Mat local_158;
  Mat local_108;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var7 = this->_vptr_Convolution_x86_avx512[-3];
  iVar3 = *(int *)(p_Var7 + 0x34 + (long)&(this->weight_winograd23_data).data);
  iVar4 = *(int *)(p_Var7 + 0x44 + (long)&(this->weight_winograd23_data).data);
  uVar5 = *(uint *)(p_Var7 + 0x3c + (long)&(this->weight_winograd23_data).data);
  uVar15 = (ulong)uVar5;
  iVar22 = (iVar3 + -1) * uVar5 + 1;
  iVar14 = (iVar1 - iVar22) / iVar4;
  iVar21 = iVar14 + 1;
  Mat::create(top_blob,iVar21,(iVar2 - iVar22) / iVar4 + 1,
              *(int *)(p_Var7 + 0x30 + (long)&(this->weight_winograd23_data).data),_elemsize,
              opt->blob_allocator);
  iVar22 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108.elemsize._4_4_ = 0;
    local_108.elempack = 0;
    local_108.allocator = (Allocator *)0x0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    bVar29 = 0 < (int)uVar5;
    if (0 < (int)uVar5) {
      local_b8 = (long)iVar14 * 4 + 4;
      local_80 = (long)(int)(iVar21 * uVar5) << 2;
      local_180 = 0;
      local_178 = 0;
      uVar17 = 0;
      do {
        uVar12 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar17) / (long)(int)uVar5;
        iVar14 = (int)uVar12;
        uVar20 = (long)(iVar14 - iVar3) / (long)iVar4;
        local_90 = uVar20 & 0xffffffff;
        _h = (int)uVar20 + 1;
        uVar20 = 0;
        local_b0 = uVar17;
        local_a8 = local_178;
        local_a0 = local_180;
        do {
          uVar17 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar20) / (long)(int)uVar5;
          iVar21 = (int)uVar17;
          iVar22 = (iVar21 - iVar3) / iVar4;
          local_98 = uVar20;
          Mat::create(&local_108,iVar21,iVar14,bottom_blob->c,_elemsize,opt->workspace_allocator);
          if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0)) {
LAB_001de48e:
            iVar22 = -100;
            if (bVar29) goto LAB_001de4c1;
            goto LAB_001de4a2;
          }
          _w = iVar22 + 1;
          Mat::create(&local_158,_w,_h,
                      *(int *)(this->_vptr_Convolution_x86_avx512[-3] + 0x30 +
                              (long)&(this->weight_winograd23_data).data),_elemsize,
                      opt->workspace_allocator);
          if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
          goto LAB_001de48e;
          iVar6 = bottom_blob->c;
          if (0 < (long)iVar6) {
            lVar23 = (long)bottom_blob->data + local_178;
            local_88 = bottom_blob->cstep * bottom_blob->elemsize;
            lVar25 = 0;
            pvVar16 = local_108.data;
            do {
              if (0 < iVar14) {
                iVar26 = 0;
                uVar20 = 0;
                pvVar18 = pvVar16;
                do {
                  if (0 < iVar21) {
                    puVar19 = (undefined4 *)(lVar23 + (long)iVar26 * 4);
                    uVar28 = 0;
                    do {
                      *(undefined4 *)((long)pvVar18 + uVar28 * 4) = *puVar19;
                      uVar28 = uVar28 + 1;
                      puVar19 = puVar19 + uVar15;
                    } while ((uVar17 & 0xffffffff) != uVar28);
                  }
                  uVar20 = uVar20 + 1;
                  iVar26 = iVar26 + uVar5 * iVar1;
                  pvVar18 = (void *)((long)pvVar18 + (long)iVar21 * 4);
                } while (uVar20 != (uVar12 & 0xffffffff));
              }
              lVar25 = lVar25 + 1;
              lVar23 = lVar23 + local_88;
              pvVar16 = (void *)((long)pvVar16 +
                                local_108.cstep *
                                CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
            } while (lVar25 != iVar6);
          }
          auStack_68 = SUB6448(*opt,0x10);
          local_78 = SUB648(*opt,0);
          pAStack_70 = local_158.allocator;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_108,&local_158,&local_78);
          pp_Var8 = this->_vptr_Convolution_x86_avx512;
          if (0 < *(int *)(pp_Var8[-3] + 0x30 + (long)&(this->weight_winograd23_data).data)) {
            sVar9 = top_blob->cstep;
            puVar19 = (undefined4 *)((long)top_blob->data + local_180);
            sVar10 = top_blob->elemsize;
            lVar23 = 0;
            pvVar16 = local_158.data;
            do {
              if (-1 < (int)local_90) {
                uVar17 = 0;
                puVar24 = puVar19;
                pvVar18 = pvVar16;
                do {
                  if (-1 < iVar22) {
                    uVar20 = 0;
                    puVar27 = puVar24;
                    do {
                      *puVar27 = *(undefined4 *)((long)pvVar18 + uVar20 * 4);
                      uVar20 = uVar20 + 1;
                      puVar27 = puVar27 + uVar15;
                    } while (_w != uVar20);
                  }
                  uVar17 = uVar17 + 1;
                  puVar24 = (undefined4 *)((long)puVar24 + local_80);
                  pvVar18 = (void *)((long)pvVar18 + (long)(int)_w * 4);
                } while (uVar17 != _h);
              }
              lVar23 = lVar23 + 1;
              puVar19 = (undefined4 *)((long)puVar19 + sVar9 * sVar10);
              pvVar16 = (void *)((long)pvVar16 +
                                local_158.cstep *
                                CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
            } while (lVar23 < *(int *)(pp_Var8[-3] + 0x30 +
                                      (long)&(this->weight_winograd23_data).data));
          }
          uVar20 = local_98 + 1;
          local_178 = local_178 + 4;
          local_180 = local_180 + 4;
        } while (uVar20 != uVar15);
        uVar17 = local_b0 + 1;
        bVar29 = uVar17 < uVar15;
        local_178 = local_a8 + (long)iVar1 * 4;
        local_180 = local_a0 + local_b8;
      } while (uVar17 != uVar15);
    }
LAB_001de4a2:
    pLVar11 = this->activation;
    if (pLVar11 == (Layer *)0x0) {
      iVar22 = 0;
    }
    else {
      (*pLVar11->_vptr_Layer[9])(pLVar11,top_blob,opt);
      iVar22 = 0;
    }
LAB_001de4c1:
    piVar13 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    piVar13 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar22;
}

Assistant:

int Convolution_x86_avx512::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}